

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonIntValReq>::
     _throwLowerGtUpper<long_long,unsigned_long_long>
               (longlong lower,unsigned_long_long upper,TextLocation *loc)

{
  ostream *poVar1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  TextLocation *loc_local;
  unsigned_long_long upper_local;
  longlong lower_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,lower);
  poVar1 = std::operator<<(poVar1," is greater than ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,upper);
  std::operator<<(poVar1,'.');
  std::__cxx11::ostringstream::str();
  throwTextParseError(&local_1c8,*loc);
}

Assistant:

static void _throwLowerGtUpper(const LowerT lower, const UpperT upper, const TextLocation& loc)
    {
        std::ostringstream ss;

        ss << lower << " is greater than " << upper << '.';
        throwTextParseError(ss.str(), loc);
    }